

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Minisat::SimpSolver::strengthenClause(SimpSolver *this,CRef cr,Lit l)

{
  uint64_t *puVar1;
  int *piVar2;
  FILE *pFVar3;
  vec<unsigned_int> *pvVar4;
  uint *puVar5;
  bool bVar6;
  CRef CVar7;
  uint uVar8;
  int v;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  anon_struct_8_10_eb538618_for_header *c;
  
  c = (anon_struct_8_10_eb538618_for_header *)
      ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory + cr);
  puVar1 = &(this->super_Solver).statistics.simpSteps;
  *puVar1 = *puVar1 + 1;
  Queue<unsigned_int>::insert(&this->subsumption_queue,cr);
  pFVar3 = (this->super_Solver).drup_file;
  if (pFVar3 != (FILE *)0x0) {
    Solver::binDRUP_strengthen(&this->super_Solver,(Clause *)c,l,pFVar3);
  }
  if (SUB84(*c,4) >> 2 == 2) {
    removeClause(this,cr);
    Clause::strengthen((Clause *)c,l);
  }
  else {
    pFVar3 = (this->super_Solver).drup_file;
    if (pFVar3 != (FILE *)0x0) {
      Solver::binDRUP<Minisat::Clause>(&this->super_Solver,'d',(Clause *)c,pFVar3);
    }
    Solver::detachClause(&this->super_Solver,cr,true);
    Clause::strengthen((Clause *)c,l);
    Solver::attachClause(&this->super_Solver,cr);
    v = l.x >> 1;
    pvVar4 = (this->occurs).occs.data;
    uVar8 = pvVar4[v].sz;
    puVar5 = pvVar4[v].data;
    uVar11 = 0;
    uVar9 = 0;
    if (0 < (int)uVar8) {
      uVar9 = (ulong)uVar8;
    }
    for (; (uVar10 = uVar9, uVar9 != uVar11 && (uVar10 = uVar11, puVar5[uVar11] != cr));
        uVar11 = uVar11 + 1) {
    }
    for (; (long)uVar10 < (long)(int)(uVar8 - 1); uVar10 = uVar10 + 1) {
      puVar5[uVar10] = puVar5[uVar10 + 1];
      uVar8 = pvVar4[v].sz;
    }
    pvVar4[v].sz = uVar8 - 1;
    piVar2 = (this->n_occ).data + l.x;
    *piVar2 = *piVar2 + -1;
    updateElimHeap(this,v);
  }
  bVar6 = true;
  if (((ulong)*c & 0xfffffffc00000000) == 0x400000000) {
    bVar6 = Solver::enqueue(&this->super_Solver,(Lit)*(int *)(c + 1),0xffffffff);
    if (bVar6) {
      CVar7 = Solver::propagate(&this->super_Solver);
      bVar6 = CVar7 == 0xffffffff;
    }
    else {
      bVar6 = false;
    }
  }
  return bVar6;
}

Assistant:

bool SimpSolver::strengthenClause(CRef cr, Lit l)
{
    Clause &c = ca[cr];
    statistics.simpSteps++;
    assert(decisionLevel() == 0);
    assert(use_simplification);

    // FIX: this is too inefficient but would be nice to have (properly implemented)
    // if (!find(subsumption_queue, &c))
    subsumption_queue.insert(cr);

    if (drup_file) {
#ifdef BIN_DRUP
        binDRUP_strengthen(c, l, drup_file);
#else
        for (int i = 0; i < c.size(); i++)
            if (c[i] != l) fprintf(drup_file, "%i ", (var(c[i]) + 1) * (-2 * sign(c[i]) + 1));
        fprintf(drup_file, "0\n");
#endif
    }

    if (c.size() == 2) {
        removeClause(cr);
        c.strengthen(l);
    } else {
        if (drup_file) {
#ifdef BIN_DRUP
            binDRUP('d', c, drup_file);
#else
            fprintf(drup_file, "d ");
            for (int i = 0; i < c.size(); i++) fprintf(drup_file, "%i ", (var(c[i]) + 1) * (-2 * sign(c[i]) + 1));
            fprintf(drup_file, "0\n");
#endif
        }

        detachClause(cr, true);
        c.strengthen(l);
        attachClause(cr);
        remove(occurs[var(l)], cr);
        n_occ[toInt(l)]--;
        updateElimHeap(var(l));
    }

    return c.size() == 1 ? enqueue(c[0]) && propagate() == CRef_Undef : true;
}